

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O2

char * Abc_SopEncoderLog(Mem_Flex_t *pMan,int iBit,int nValues)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Vec_Str_t *p;
  char *pcVar4;
  int nCap;
  uint uVar5;
  
  nCap = nValues;
  iVar2 = Abc_Base2Log(nValues);
  if (iBit < iVar2) {
    uVar5 = 0;
    if (nValues < 1) {
      nValues = 0;
    }
    for (uVar3 = 0; nValues != uVar3; uVar3 = uVar3 + 1) {
      uVar5 = uVar5 + ((uVar3 >> (iBit & 0x1fU) & 1) != 0);
    }
    p = Vec_StrAlloc(nCap);
    Vec_StrPrintStr(p,"d0\n");
    if (1 < uVar5) {
      Vec_StrPrintStr(p,"(");
    }
    bVar1 = true;
    for (uVar3 = 0; nValues != uVar3; uVar3 = uVar3 + 1) {
      if ((uVar3 & 1 << ((byte)iBit & 0x1f)) != 0) {
        if (!bVar1) {
          Vec_StrPush(p,',');
        }
        Vec_StrPrintNum(p,uVar3);
        bVar1 = false;
      }
    }
    if (1 < uVar5) {
      Vec_StrPrintStr(p,")");
    }
    Vec_StrPrintStr(p," 1\n");
    Vec_StrPush(p,'\0');
    pcVar4 = Abc_SopRegister(pMan,p->pArray);
    Vec_StrFree(p);
    return pcVar4;
  }
  __assert_fail("iBit < nBits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                ,0x449,"char *Abc_SopEncoderLog(Mem_Flex_t *, int, int)");
}

Assistant:

char * Abc_SopEncoderLog( Mem_Flex_t * pMan, int iBit, int nValues )
{
    char * pResult;
    Vec_Str_t * vSop;
    int v, Counter, fFirst = 1, nBits = Abc_Base2Log(nValues);
    assert( iBit < nBits );
    // count the number of literals
    Counter = 0;
    for ( v = 0; v < nValues; v++ )
        Counter += ( (v & (1 << iBit)) > 0 );
    // create the cover
    vSop = Vec_StrAlloc( 100 );
    Vec_StrPrintStr( vSop, "d0\n" );
    if ( Counter > 1 )
        Vec_StrPrintStr( vSop, "(" );
    for ( v = 0; v < nValues; v++ )
        if ( v & (1 << iBit) )
        {
            if ( fFirst )
                fFirst = 0;
            else
                Vec_StrPush( vSop, ',' );
            Vec_StrPrintNum( vSop, v );
        }
    if ( Counter > 1 )
        Vec_StrPrintStr( vSop, ")" );
    Vec_StrPrintStr( vSop, " 1\n" );
    Vec_StrPush( vSop, 0 );
    pResult = Abc_SopRegister( pMan, Vec_StrArray(vSop) );
    Vec_StrFree( vSop );
    return pResult;
}